

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qexception.cpp
# Opt level: O0

void __thiscall QtPrivate::ExceptionStore::setException(ExceptionStore *this,exception_ptr *e)

{
  exception_ptr *in_RDI;
  exception_ptr *unaff_retaddr;
  
  std::__exception_ptr::exception_ptr::operator=(unaff_retaddr,in_RDI);
  return;
}

Assistant:

void ExceptionStore::setException(std::exception_ptr e)
{
    Q_ASSERT(!hasException());
    exceptionHolder = e;
}